

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

vector4 * vector4_get_reference_vector4(int id)

{
  if (id - 1U < 7) {
    return (vector4 *)(&PTR__vector4_unit_x_00117db0)[id - 1U];
  }
  return &_vector4_zero;
}

Assistant:

HYPAPI const struct vector4 *vector4_get_reference_vector4(int id)
{
	switch (id) {
	case HYP_REF_VECTOR4_ZERO:
		return &_vector4_zero;
	case HYP_REF_VECTOR4_ONE:
		return &_vector4_one;
	case HYP_REF_VECTOR4_UNIT_X:
		return &_vector4_unit_x;
	case HYP_REF_VECTOR4_UNIT_Y:
		return &_vector4_unit_y;
	case HYP_REF_VECTOR4_UNIT_Z:
		return &_vector4_unit_z;
	case HYP_REF_VECTOR4_UNIT_X_NEGATIVE:
		return &_vector4_unit_x_negative;
	case HYP_REF_VECTOR4_UNIT_Y_NEGATIVE:
		return &_vector4_unit_y_negative;
	case HYP_REF_VECTOR4_UNIT_Z_NEGATIVE:
		return &_vector4_unit_z_negative;
	default:
		/* undefined case */
		return &_vector4_zero;
	}
}